

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeOperations.cpp
# Opt level: O1

string * __thiscall
soul::SourceCodeOperations::ModuleDeclaration::getName_abi_cxx11_
          (string *__return_storage_ptr__,ModuleDeclaration *this)

{
  string *psVar1;
  pointer pcVar2;
  
  psVar1 = (this->module->name).name;
  if (psVar1 != (string *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (psVar1->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + psVar1->_M_string_length);
    return __return_storage_ptr__;
  }
  throwInternalCompilerError("isValid()","toString",0x23);
}

Assistant:

std::string SourceCodeOperations::ModuleDeclaration::getName() const
{
    return module.name.toString();
}